

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVectorTests.cpp
# Opt level: O2

void (anonymous_namespace)::
     makeSequence<slang::SmallVector<(anonymous_namespace)::Constructable,4ul>>
               (SmallVector<(anonymous_namespace)::Constructable,_4UL> *v,int start,int end)

{
  Constructable in_RAX;
  Constructable local_28;
  
  local_28 = in_RAX;
  for (; start <= end; start = start + 1) {
    local_28.constructed = true;
    local_28.value = start;
    Constructable::numConstructorCalls = Constructable::numConstructorCalls + 1;
    slang::SmallVectorBase<(anonymous_namespace)::Constructable>::push_back
              (&v->super_SmallVectorBase<(anonymous_namespace)::Constructable>,&local_28);
    anon_unknown.dwarf_965823::Constructable::~Constructable(&local_28);
  }
  return;
}

Assistant:

void makeSequence(TVector& v, int start, int end) {
    for (int i = start; i <= end; ++i)
        v.push_back(Constructable(i));
}